

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

bool __thiscall rtosc::MidiMappernRT::hasFinePending(MidiMappernRT *this,string *addr)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *ppVar1;
  __type _Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *ppVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *ppVar4;
  _Map_pointer pppVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> s;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  pStack_58;
  
  ppVar3 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar4 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar5 = (this->learnQueue).
            super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar1 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  do {
    if (ppVar3 == ppVar1) {
LAB_001117e8:
      return ppVar3 != ppVar1;
    }
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::pair(&pStack_58,ppVar3);
    _Var2 = std::operator==(&pStack_58.first,addr);
    if ((_Var2) && (pStack_58.second != true)) {
      std::__cxx11::string::~string((string *)&pStack_58);
      goto LAB_001117e8;
    }
    std::__cxx11::string::~string((string *)&pStack_58);
    ppVar3 = ppVar3 + 1;
    if (ppVar3 == ppVar4) {
      ppVar3 = pppVar5[1];
      pppVar5 = pppVar5 + 1;
      ppVar4 = ppVar3 + 0xc;
    }
  } while( true );
}

Assistant:

bool MidiMappernRT::hasFinePending(std::string addr)
{
    for(auto s:learnQueue)
        if(s.first == addr && !s.second)
            return true;
    return false;
}